

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QGridLayoutBox>::insert
          (QMovableArrayOps<QGridLayoutBox> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  QGridLayoutBox *pQVar2;
  void *in_RCX;
  QArrayDataPointer<QGridLayoutBox> *in_RDX;
  long in_RSI;
  QArrayDataPointer<QGridLayoutBox> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  GrowthPosition pos;
  bool growsAtBegin;
  QGridLayoutBox copy;
  qsizetype in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  QArrayDataPointer<QGridLayoutBox> *pQVar6;
  Inserter local_58;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_30,0,0x28);
  local_30 = 0xffffffffffffffff;
  local_28 = 0xffffffffffffffff;
  local_20 = 0xffffffffffffffff;
  local_18 = 0xffffffffffffffff;
  local_10 = 0xffffffffffffffff;
  memcpy(&local_30,in_RCX,0x28);
  bVar3 = in_RDI->size != 0;
  uVar4 = bVar3 && in_RSI == 0;
  uVar5 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffff84);
  uVar1 = (uint)(bVar3 && in_RSI == 0);
  QArrayDataPointer<QGridLayoutBox>::detachAndGrow
            (in_RDX,(GrowthPosition)((ulong)in_RCX >> 0x20),CONCAT44(uVar5,uVar1),
             (QGridLayoutBox **)CONCAT17(uVar4,in_stack_ffffffffffffff78),in_RDI);
  if ((uVar5 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(uVar5,uVar1),
                       (QArrayDataPointer<QGridLayoutBox> *)
                       CONCAT17(uVar4,in_stack_ffffffffffffff78),(qsizetype)in_RDI,
                       in_stack_ffffffffffffff68);
    Inserter::insertFill
              ((Inserter *)CONCAT44(uVar5,uVar1),
               (QGridLayoutBox *)CONCAT17(uVar4,in_stack_ffffffffffffff78),(qsizetype)in_RDI);
    Inserter::~Inserter(&local_58);
  }
  else {
    while (pQVar6 = (QArrayDataPointer<QGridLayoutBox> *)((long)&in_RDX[-1].size + 7),
          in_RDX != (QArrayDataPointer<QGridLayoutBox> *)0x0) {
      pQVar2 = QArrayDataPointer<QGridLayoutBox>::begin
                         ((QArrayDataPointer<QGridLayoutBox> *)0x8b535e);
      memcpy(pQVar2 + -1,&local_30,0x28);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      in_RDX = pQVar6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }